

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

int __thiscall Track::data_extent_bits(Track *this,Sector *sector)

{
  bool bVar1;
  pointer pSVar2;
  int local_78;
  int local_74;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_68;
  Sector *local_60;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_58;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_50;
  Sector *local_48;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_40 [2];
  int local_30;
  int gap_bits;
  int track_len;
  int drive_speed;
  __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_> local_20;
  const_iterator it;
  Sector *sector_local;
  Track *this_local;
  
  it._M_current = sector;
  local_20._M_current = (Sector *)find(this,sector);
  _track_len = end(this);
  bVar1 = __gnu_cxx::operator!=
                    (&local_20,
                     (__normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>
                      *)&track_len);
  if (!bVar1) {
    __assert_fail("it != end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Track.cpp"
                  ,0x4a,"int Track::data_extent_bits(const Sector &) const");
  }
  gap_bits = 200000;
  if ((it._M_current)->datarate == _300K) {
    gap_bits = 0x28b0b;
  }
  if (this->tracklen == 0) {
    local_74 = GetTrackCapacity(gap_bits,(it._M_current)->datarate,(it._M_current)->encoding);
  }
  else {
    local_74 = this->tracklen;
  }
  local_30 = local_74;
  local_48 = local_20._M_current;
  local_40[0] = std::
                next<__gnu_cxx::__normal_iterator<Sector_const*,std::vector<Sector,std::allocator<Sector>>>>
                          (local_20,1);
  local_50._M_current = (Sector *)end(this);
  bVar1 = __gnu_cxx::operator!=(local_40,&local_50);
  local_78 = local_30;
  if (bVar1) {
    local_60 = local_20._M_current;
    local_58 = std::
               next<__gnu_cxx::__normal_iterator<Sector_const*,std::vector<Sector,std::allocator<Sector>>>>
                         (local_20,1);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
             operator->(&local_58);
    local_78 = pSVar2->offset;
  }
  else {
    local_68._M_current = (Sector *)begin(this);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Sector_*,_std::vector<Sector,_std::allocator<Sector>_>_>::
             operator->(&local_68);
    local_78 = local_78 + pSVar2->offset;
  }
  return local_78 - (it._M_current)->offset;
}

Assistant:

int Track::data_extent_bits(const Sector& sector) const
{
    auto it = find(sector);
    assert(it != end());

    auto drive_speed = (sector.datarate == DataRate::_300K) ? RPM_TIME_360 : RPM_TIME_300;
    auto track_len = tracklen ? tracklen : GetTrackCapacity(drive_speed, sector.datarate, sector.encoding);

    // Approximate bit distance to next ID header.
    auto gap_bits = ((std::next(it) != end()) ? std::next(it)->offset : (track_len + begin()->offset)) - sector.offset;
    return gap_bits;
}